

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake_test.c
# Opt level: O1

bool_t bakeTest(void)

{
  err_t eVar1;
  err_t eVar2;
  bool_t bVar3;
  size_t sVar4;
  char pwd [5];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  octet keya [32];
  octet keyb [32];
  octet randb [48];
  octet randa [48];
  octet secret [32];
  octet db [32];
  octet da [32];
  bake_cert certb [1];
  bake_cert certa [1];
  bake_settings settingsb [1];
  bake_settings settingsa [1];
  octet iv [64];
  octet echob [64];
  octet echoa [64];
  bign_params params [1];
  octet certdatab [72];
  octet certdataa [72];
  
  builtin_strncpy(pwd,"8086",5);
  sVar4 = prngEcho_keep();
  if ((sVar4 < 0x41) && (eVar1 = bignParamsStd(params,"1.2.112.0.2.0.34.101.45.3.1"), eVar1 == 0)) {
    memSet(settingsa,'\0',0x38);
    memSet(settingsb,'\0',0x38);
    settingsa[0].kca = 1;
    settingsa[0].kcb = 1;
    settingsb[0].kca = 1;
    settingsb[0].kcb = 1;
    settingsb[0].rng = prngEchoStepR;
    settingsa[0].rng = prngEchoStepR;
    settingsa[0].rng_state = echoa;
    settingsb[0].rng_state = echob;
    hexTo(da,"1F66B5B84B7339674533F0329C74F21834281FED0732429E0C79235FC273E269");
    hexTo(db,"4C0E74B2CD5811AD21F23DE7E0FA742C3ED6EC483C461CE15C33A77AA308B7D2");
    hexTo(certdataa,
          "416C696365BD1A5650179D79E03FCEE49D4C2BD5DDF54CE46D0CF11E4FF87BF7A890857FD07AC6A60361E8C8173491686D461B2826190C2EDA5909054A9AB84D2AB9D99A90"
         );
    hexTo(certdatab,
          "426F62CCEEF1A313A406649D15DA0A851D486A695B641B20611776252FFDCE39C710607C9EA1F33C23D20DFCB8485A88BE6523A28ECC3215B47FA289D6C9BE1CE837C0"
         );
    certa[0].data = certdataa;
    sVar4 = strLen(
                  "416C696365BD1A5650179D79E03FCEE49D4C2BD5DDF54CE46D0CF11E4FF87BF7A890857FD07AC6A60361E8C8173491686D461B2826190C2EDA5909054A9AB84D2AB9D99A90"
                  );
    certa[0].len = sVar4 >> 1;
    certb[0].data = certdatab;
    sVar4 = strLen(
                  "426F62CCEEF1A313A406649D15DA0A851D486A695B641B20611776252FFDCE39C710607C9EA1F33C23D20DFCB8485A88BE6523A28ECC3215B47FA289D6C9BE1CE837C0"
                  );
    certb[0].len = sVar4 >> 1;
    certb[0].val = bakeTestCertVal;
    certa[0].val = bakeTestCertVal;
    hexTo(randa,"0A4E8298BE0839E46F19409F637F4415572251DD0D39284F0F0390D93BBCE9EC");
    hexTo(randb,"0F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5");
    memSet(_msgs,'\0',0x1040);
    do {
      local_4a8 = 0;
      uStack_4a0 = 0;
      local_4b8 = 0;
      uStack_4b0 = 0;
      sVar4 = strLen("0F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5");
      prngEchoStart(echoa,randa,sVar4 >> 1);
      sVar4 = strLen("0F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5");
      prngEchoStart(echob,randb,sVar4 >> 1);
      eVar1 = bakeBMQVRunB(keyb,params,settingsb,db,certb,certa,fileMsgRead,fileMsgWrite,&local_4b8)
      ;
      if ((eVar1 != 0xca) && (eVar1 != 0)) {
        return 0;
      }
      eVar2 = bakeBMQVRunA(keya,params,settingsa,da,certa,certb,fileMsgRead,fileMsgWrite,&local_4a8)
      ;
      if ((eVar2 != 0xca) && (eVar2 != 0)) {
        return 0;
      }
    } while (eVar1 == 0xca || eVar2 == 0xca);
    bVar3 = memEq(keya,keyb,0x20);
    if (bVar3 != 0) {
      bVar3 = hexEq(keya,"C6F86D0E468D5EF1A9955B2EE0CF0581050C81D1B47727092408E863C7EEB48C");
      if (bVar3 == 0) {
        return 0;
      }
      hexTo(randa,"0A4E8298BE0839E46F19409F637F4415572251DD0D39284F0F0390D93BBCE9EC");
      hexTo(randb,"0F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5");
      memSet(_msgs,'\0',0x1040);
      do {
        local_4a8 = 0;
        uStack_4a0 = 0;
        local_4b8 = 0;
        uStack_4b0 = 0;
        sVar4 = strLen("0F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5");
        prngEchoStart(echoa,randa,sVar4 >> 1);
        sVar4 = strLen("0F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5");
        prngEchoStart(echob,randb,sVar4 >> 1);
        eVar1 = bakeBSTSRunB(keyb,params,settingsb,db,certb,bakeTestCertVal,fileMsgRead,fileMsgWrite
                             ,&local_4b8);
        if ((eVar1 != 0xca) && (eVar1 != 0)) {
          return 0;
        }
        eVar2 = bakeBSTSRunA(keya,params,settingsa,da,certa,bakeTestCertVal,fileMsgRead,fileMsgWrite
                             ,&local_4a8);
        if ((eVar2 != 0xca) && (eVar2 != 0)) {
          return 0;
        }
      } while (eVar1 == 0xca || eVar2 == 0xca);
      bVar3 = memEq(keya,keyb,0x20);
      if (bVar3 != 0) {
        bVar3 = hexEq(keya,"78EF2C56BD6DA2116BB5BEE80CEE5C05394E7609183CF7F76DF0C2DCFB25C4AD");
        if (bVar3 == 0) {
          return 0;
        }
        hexTo(randa,
              "AD1362A8F9A3D42FBE1B8E6F1C88AAD50A4E8298BE0839E46F19409F637F4415572251DD0D39284F0F0390D93BBCE9EC"
             );
        hexTo(randb,
              "0F51D91347617C20BD4AB07AEF4F26A1F81B29D571F6452FF8B2B97F57E18A58BC946FEE45EAB32B06FCAC23A33F422B"
             );
        memSet(_msgs,'\0',0x1040);
        do {
          local_4a8 = 0;
          uStack_4a0 = 0;
          local_4b8 = 0;
          uStack_4b0 = 0;
          sVar4 = strLen(
                        "0F51D91347617C20BD4AB07AEF4F26A1F81B29D571F6452FF8B2B97F57E18A58BC946FEE45EAB32B06FCAC23A33F422B"
                        );
          prngEchoStart(echoa,randa,sVar4 >> 1);
          sVar4 = strLen(
                        "0F51D91347617C20BD4AB07AEF4F26A1F81B29D571F6452FF8B2B97F57E18A58BC946FEE45EAB32B06FCAC23A33F422B"
                        );
          prngEchoStart(echob,randb,sVar4 >> 1);
          sVar4 = strLen(pwd);
          eVar1 = bakeBPACERunB(keyb,params,settingsb,(octet *)pwd,sVar4,fileMsgRead,fileMsgWrite,
                                &local_4b8);
          if ((eVar1 != 0xca) && (eVar1 != 0)) {
            return 0;
          }
          sVar4 = strLen(pwd);
          eVar2 = bakeBPACERunA(keya,params,settingsa,(octet *)pwd,sVar4,fileMsgRead,fileMsgWrite,
                                &local_4a8);
          if ((eVar2 != 0xca) && (eVar2 != 0)) {
            return 0;
          }
        } while (eVar1 == 0xca || eVar2 == 0xca);
        bVar3 = memEq(keya,keyb,0x20);
        if (bVar3 != 0) {
          bVar3 = hexEq(keya,"DAC4D8F411F9C523D28BBAAB32A5270E4DFA1F0F757EF8E0F30AF08FBDE1E7F4");
          if (bVar3 == 0) {
            return 0;
          }
          hexTo(secret,"723356E335ED70620FFB1842752092C32603EB666040920587D800575BECFC42");
          hexTo(iv,
                "6B13ACBB086FB87618BCC2EF20A3FA89475654CB367E670A2441730B24B8AB31CD3D6487DC4EEB23456978186A069C71375D75C2DF198BAD1E61EEA0DBBFF737"
               );
          eVar1 = bakeKDF(keya,secret,0x20,iv,0x40,0);
          if (eVar1 != 0) {
            return 0;
          }
          eVar1 = bakeKDF(keyb,secret,0x20,iv,0x40,1);
          if (eVar1 != 0) {
            return 0;
          }
          bVar3 = hexEq(keya,"DAC4D8F411F9C523D28BBAAB32A5270E4DFA1F0F757EF8E0F30AF08FBDE1E7F4");
          if (bVar3 == 0) {
            return 0;
          }
          bVar3 = hexEq(keyb,"54AC058284D679CF4C47D3D72651F3E4EF0D61D1D0ED5BAF8FF30B8924E599D8");
          if (bVar3 == 0) {
            return 0;
          }
          hexTo(secret,"AD1362A8F9A3D42FBE1B8E6F1C88AAD50F51D91347617C20BD4AB07AEF4F26A1");
          eVar1 = bakeSWU(iv,params,secret);
          if (eVar1 != 0) {
            return 0;
          }
          bVar3 = hexEq(iv,
                        "014417D3355557317D2E2AB6D08754878D19E8D97B71FDC95DBB2A9B894D16D77704A0B5CAA9CDA10791E4760671E1050DDEAB7083A7458447866ADB01473810"
                       );
          return (uint)(bVar3 != 0);
        }
      }
    }
  }
  return 0;
}

Assistant:

bool_t bakeTest()
{
	err_t codea;
	err_t codeb;
	bign_params params[1];
	octet randa[48];
	octet randb[48];
	octet echoa[64];
	octet echob[64];
	bake_settings settingsa[1];
	bake_settings settingsb[1];
	octet da[32];
	octet db[32];
	octet certdataa[5 /* Alice */ + 64 + 3 /* align */];
	octet certdatab[3 /* Bob */ + 64 + 5 /* align */];
	bake_cert certa[1];
	bake_cert certb[1];
	file_msg_st filea[1];
	file_msg_st fileb[1];
	const char pwd[] = "8086";
	octet keya[32];
	octet keyb[32];
	octet secret[32];
	octet iv[64];
	// подготовить память
	if (sizeof(echoa) < prngEcho_keep())
		return FALSE;
	// загрузить долговременные параметры
	if (bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.1") != ERR_OK)
		return FALSE;
	// задать настройки
	memSetZero(settingsa, sizeof(bake_settings));
	memSetZero(settingsb, sizeof(bake_settings));
	settingsa->kca = settingsa->kcb = TRUE;
	settingsb->kca = settingsb->kcb = TRUE;
	settingsa->rng = settingsb->rng = prngEchoStepR;
	settingsa->rng_state = echoa;
	settingsb->rng_state = echob;
	// загрузить личные ключи
	hexTo(da, _da);
	hexTo(db, _db);
	// загрузить сертификаты
	hexTo(certdataa, _certa);
	hexTo(certdatab, _certb);
	certa->data = certdataa;
	certa->len = strLen(_certa) / 2;
	certb->data = certdatab;
	certb->len = strLen(_certb) / 2;
	certa->val = certb->val = bakeTestCertVal;
	// тест Б.2
	hexTo(randa, _bmqv_randa);
	hexTo(randb, _bmqv_randb);
	fileMsgFlash();
	do
	{
		filea->i = filea->offset = 0;
		fileb->i = fileb->offset = 0;
		prngEchoStart(echoa, randa, strLen(_bmqv_randb) / 2);
		prngEchoStart(echob, randb, strLen(_bmqv_randb) / 2);
		codeb = bakeBMQVRunB(keyb, params, settingsb, db, certb, certa,
			fileMsgRead, fileMsgWrite, fileb);
		if (codeb != ERR_OK && codeb != ERR_FILE_NOT_FOUND)
			return FALSE;
		codea = bakeBMQVRunA(keya, params, settingsa, da, certa, certb,
			fileMsgRead, fileMsgWrite, filea);
		if (codea != ERR_OK && codea != ERR_FILE_NOT_FOUND)
			return FALSE;
	}
	while (codea == ERR_FILE_NOT_FOUND || codeb == ERR_FILE_NOT_FOUND);
	if (!memEq(keya, keyb, 32) ||
		!hexEq(keya,
			"C6F86D0E468D5EF1A9955B2EE0CF0581"
			"050C81D1B47727092408E863C7EEB48C"))
		return FALSE;
	// тест Б.3
	hexTo(randa, _bsts_randa);
	hexTo(randb, _bsts_randb);
	fileMsgFlash();
	do
	{
		filea->i = filea->offset = 0;
		fileb->i = fileb->offset = 0;
		prngEchoStart(echoa, randa, strLen(_bsts_randb) / 2);
		prngEchoStart(echob, randb, strLen(_bsts_randb) / 2);
		codeb = bakeBSTSRunB(keyb, params, settingsb, db, certb,
			bakeTestCertVal, fileMsgRead, fileMsgWrite, fileb);
		if (codeb != ERR_OK && codeb != ERR_FILE_NOT_FOUND)
			return FALSE;
		codea = bakeBSTSRunA(keya, params, settingsa, da, certa,
			bakeTestCertVal, fileMsgRead, fileMsgWrite, filea);
		if (codea != ERR_OK && codea != ERR_FILE_NOT_FOUND)
			return FALSE;
	}
	while (codea == ERR_FILE_NOT_FOUND || codeb == ERR_FILE_NOT_FOUND);
	if (!memEq(keya, keyb, 32) ||
		!hexEq(keya,
			"78EF2C56BD6DA2116BB5BEE80CEE5C05"
			"394E7609183CF7F76DF0C2DCFB25C4AD"))
		return FALSE;
	// тест Б.4
	hexTo(randa, _bpace_randa);
	hexTo(randb, _bpace_randb);
	fileMsgFlash();
	do
	{
		filea->i = filea->offset = 0;
		fileb->i = fileb->offset = 0;
		prngEchoStart(echoa, randa, strLen(_bpace_randb) / 2);
		prngEchoStart(echob, randb, strLen(_bpace_randb) / 2);
		codeb = bakeBPACERunB(keyb, params, settingsb, (const octet*)pwd,
			strLen(pwd), fileMsgRead, fileMsgWrite, fileb);
		if (codeb != ERR_OK && codeb != ERR_FILE_NOT_FOUND)
			return FALSE;
		codea = bakeBPACERunA(keya, params, settingsa, (const octet*)pwd,
			strLen(pwd), fileMsgRead, fileMsgWrite, filea);
		if (codea != ERR_OK && codea != ERR_FILE_NOT_FOUND)
			return FALSE;
	}
	while (codea == ERR_FILE_NOT_FOUND || codeb == ERR_FILE_NOT_FOUND);
	if (!memEq(keya, keyb, 32) ||
		!hexEq(keya,
			"DAC4D8F411F9C523D28BBAAB32A5270E"
			"4DFA1F0F757EF8E0F30AF08FBDE1E7F4"))
		return FALSE;
	// тест bakeKDF (по данным из теста Б.4)
	hexTo(secret, 
		"723356E335ED70620FFB1842752092C3"
		"2603EB666040920587D800575BECFC42");
	hexTo(iv, 
		"6B13ACBB086FB87618BCC2EF20A3FA89"
		"475654CB367E670A2441730B24B8AB31"
		"CD3D6487DC4EEB23456978186A069C71"
		"375D75C2DF198BAD1E61EEA0DBBFF737");
	if (bakeKDF(keya, secret, 32, iv, 64, 0) != ERR_OK ||
		bakeKDF(keyb, secret, 32, iv, 64, 1) != ERR_OK ||
		!hexEq(keya,
			"DAC4D8F411F9C523D28BBAAB32A5270E"
			"4DFA1F0F757EF8E0F30AF08FBDE1E7F4") ||
		!hexEq(keyb,
			"54AC058284D679CF4C47D3D72651F3E4"
			"EF0D61D1D0ED5BAF8FF30B8924E599D8"))
		return FALSE;
	// тест bakeSWU (по данным из теста Б.4)
	hexTo(secret, 
		"AD1362A8F9A3D42FBE1B8E6F1C88AAD5"
		"0F51D91347617C20BD4AB07AEF4F26A1");
	if (bakeSWU(iv, params, secret) != ERR_OK ||
		!hexEq(iv,
			"014417D3355557317D2E2AB6D0875487"
			"8D19E8D97B71FDC95DBB2A9B894D16D7"
			"7704A0B5CAA9CDA10791E4760671E105"
			"0DDEAB7083A7458447866ADB01473810"))
		return FALSE;
	// все нормально
	return TRUE;
}